

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall cmSourceFileLocation::DirectoryUseBinary(cmSourceFileLocation *this)

{
  char *in_base;
  string local_30;
  cmSourceFileLocation *local_10;
  cmSourceFileLocation *this_local;
  
  local_10 = this;
  if (this->Makefile != (cmMakefile *)0x0) {
    if ((this->AmbiguousDirectory & 1U) != 0) {
      in_base = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_30,&this->Directory,in_base);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      this->AmbiguousDirectory = false;
    }
    return;
  }
  __assert_fail("this->Makefile",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSourceFileLocation.cxx"
                ,0x67,"void cmSourceFileLocation::DirectoryUseBinary()");
}

Assistant:

void cmSourceFileLocation::DirectoryUseBinary()
{
  assert(this->Makefile);
  if(this->AmbiguousDirectory)
    {
    this->Directory =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    this->AmbiguousDirectory = false;
    }
}